

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * __thiscall
pbrt::Image::GaussianFilter
          (Image *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,int halfWidth,
          Float sigma)

{
  float *pfVar1;
  int iVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  byte bVar18;
  byte bVar19;
  pointer pbVar20;
  iterator __begin1;
  Allocator AVar21;
  pointer pfVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  ushort uVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels_00;
  int nc;
  vector<float,_std::allocator<float>_> wts;
  Image blurx;
  undefined4 local_160;
  int local_15c;
  Image *local_158;
  uint local_150;
  float local_14c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<float,_std::allocator<float>_> local_130;
  _Any_data local_118;
  code *pcStack_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *pcStack_e8;
  code *pcStack_e0;
  ColorEncodingHandle local_d8;
  ColorEncodingHandle local_d0;
  Image local_c8;
  
  local_c8.format = U256;
  local_15c = halfWidth;
  local_158 = __return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_130,(long)(halfWidth * 2 + 1),(value_type_conflict1 *)&local_c8,
             (allocator_type *)&local_148);
  if (-1 < halfWidth) {
    uVar23 = 0;
    fVar33 = sigma * 6.2831855 * sigma;
    auVar35._0_12_ = ZEXT812(0);
    auVar35._12_4_ = 0;
    auVar35 = vsqrtss_avx(auVar35,ZEXT416((uint)fVar33));
    auVar36 = ZEXT1664(auVar35);
    local_150 = auVar35._0_4_;
    local_14c = fVar33;
    do {
      fVar32 = auVar36._0_4_;
      if (fVar33 < 0.0) {
        fVar32 = sqrtf(fVar33);
        auVar36 = ZEXT464(local_150);
        fVar33 = local_14c;
      }
      fVar34 = (float)((int)uVar23 - halfWidth);
      fVar34 = ((fVar34 * fVar34) / ((sigma + sigma) * sigma)) * -1.442695;
      auVar35 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
      fVar34 = fVar34 - auVar35._0_4_;
      auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar34),
                                SUB6416(ZEXT464(0x3e679a0b),0));
      auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)fVar34),SUB6416(ZEXT464(0x3f321004),0));
      auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)fVar34),SUB6416(ZEXT464(0x3f800000),0));
      fVar34 = 0.0;
      iVar2 = (int)auVar35._0_4_ + -0x7f + (auVar17._0_4_ >> 0x17);
      if ((-0x7f < iVar2) && (fVar34 = INFINITY, iVar2 < 0x80)) {
        fVar34 = (float)(iVar2 * 0x800000 + 0x3f800000U | auVar17._0_4_ & 0x807fffff);
      }
      bVar25 = uVar23 < (uint)(halfWidth * 2);
      local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar23] = (1.0 / fVar32) * fVar34;
      uVar23 = uVar23 + 1;
    } while (bVar25);
  }
  if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    fVar33 = 0.0;
    pfVar22 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      fVar33 = fVar33 + *pfVar22;
      pfVar22 = pfVar22 + 1;
    } while (pfVar22 !=
             local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar28 = vbroadcastss_avx512f(ZEXT416((uint)fVar33));
      uVar23 = 0;
      auVar29 = vpbroadcastq_avx512f();
      auVar29 = vpsrlq_avx512f(auVar29,2);
      do {
        auVar30 = vpbroadcastq_avx512f();
        auVar31 = vporq_avx512f(auVar30,auVar36);
        auVar30 = vporq_avx512f(auVar30,auVar27);
        uVar16 = vpcmpuq_avx512f(auVar30,auVar29,2);
        bVar18 = (byte)uVar16;
        uVar16 = vpcmpuq_avx512f(auVar31,auVar29,2);
        bVar19 = (byte)uVar16;
        uVar26 = CONCAT11(bVar19,bVar18);
        pfVar1 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar23;
        auVar30._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * (int)pfVar1[1];
        auVar30._0_4_ = (uint)(bVar18 & 1) * (int)*pfVar1;
        auVar30._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * (int)pfVar1[2];
        auVar30._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * (int)pfVar1[3];
        auVar30._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * (int)pfVar1[4];
        auVar30._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * (int)pfVar1[5];
        auVar30._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * (int)pfVar1[6];
        auVar30._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * (int)pfVar1[7];
        auVar30._32_4_ = (uint)(bVar19 & 1) * (int)pfVar1[8];
        auVar30._36_4_ = (uint)(bVar19 >> 1 & 1) * (int)pfVar1[9];
        auVar30._40_4_ = (uint)(bVar19 >> 2 & 1) * (int)pfVar1[10];
        auVar30._44_4_ = (uint)(bVar19 >> 3 & 1) * (int)pfVar1[0xb];
        auVar30._48_4_ = (uint)(bVar19 >> 4 & 1) * (int)pfVar1[0xc];
        auVar30._52_4_ = (uint)(bVar19 >> 5 & 1) * (int)pfVar1[0xd];
        auVar30._56_4_ = (uint)(bVar19 >> 6 & 1) * (int)pfVar1[0xe];
        auVar30._60_4_ = (uint)(bVar19 >> 7) * (int)pfVar1[0xf];
        auVar30 = vdivps_avx512f(auVar30,auVar28);
        pfVar1 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar23;
        bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
        bVar10 = (bool)(bVar19 >> 1 & 1);
        bVar11 = (bool)(bVar19 >> 2 & 1);
        bVar12 = (bool)(bVar19 >> 3 & 1);
        bVar13 = (bool)(bVar19 >> 4 & 1);
        bVar14 = (bool)(bVar19 >> 5 & 1);
        bVar15 = (bool)(bVar19 >> 6 & 1);
        *pfVar1 = (float)((uint)(bVar18 & 1) * auVar30._0_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)*pfVar1);
        pfVar1[1] = (float)((uint)bVar25 * auVar30._4_4_ | (uint)!bVar25 * (int)pfVar1[1]);
        pfVar1[2] = (float)((uint)bVar4 * auVar30._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
        pfVar1[3] = (float)((uint)bVar5 * auVar30._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
        pfVar1[4] = (float)((uint)bVar6 * auVar30._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
        pfVar1[5] = (float)((uint)bVar7 * auVar30._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
        pfVar1[6] = (float)((uint)bVar8 * auVar30._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
        pfVar1[7] = (float)((uint)bVar9 * auVar30._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
        pfVar1[8] = (float)((uint)(bVar19 & 1) * auVar30._32_4_ |
                           (uint)!(bool)(bVar19 & 1) * (int)pfVar1[8]);
        pfVar1[9] = (float)((uint)bVar10 * auVar30._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
        pfVar1[10] = (float)((uint)bVar11 * auVar30._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
        pfVar1[0xb] = (float)((uint)bVar12 * auVar30._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
        pfVar1[0xc] = (float)((uint)bVar13 * auVar30._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
        pfVar1[0xd] = (float)((uint)bVar14 * auVar30._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
        pfVar1[0xe] = (float)((uint)bVar15 * auVar30._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
        pfVar1[0xf] = (float)((uint)(bVar19 >> 7) * auVar30._60_4_ |
                             (uint)!(bool)(bVar19 >> 7) * (int)pfVar1[0xf]);
        uVar23 = uVar23 + 0x10;
      } while ((((ulong)((long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish +
                        (-4 - (long)local_130.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start)) >> 2) + 0x10 &
               0xfffffffffffffff0) != uVar23);
    }
  }
  TVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  ChannelNames_abi_cxx11_(&local_148,this,desc);
  pbVar20 = local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d0.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  lVar24 = (long)local_148.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_148.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  AVar21.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = lVar24 >> 5;
  channels.ptr = pbVar20;
  Image(&local_c8,Float,(Point2i)TVar3,channels,&local_d0,AVar21);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  local_160 = (undefined4)(desc->offset).nStored;
  iVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  pcStack_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = operator_new(0x30);
  *(Image **)local_f8._M_unused._0_8_ = this;
  *(ImageChannelDesc **)((long)local_f8._M_unused._0_8_ + 8) = desc;
  *(int **)((long)local_f8._M_unused._0_8_ + 0x10) = &local_15c;
  *(undefined4 **)((long)local_f8._M_unused._0_8_ + 0x18) = &local_160;
  *(vector<float,_std::allocator<float>_> **)((long)local_f8._M_unused._0_8_ + 0x20) = &local_130;
  *(Image **)((long)local_f8._M_unused._0_8_ + 0x28) = &local_c8;
  pcStack_e0 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:211:34)>
               ::_M_invoke;
  pcStack_e8 = std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:211:34)>
               ::_M_manager;
  ParallelFor(0,(long)iVar2,(function<void_(long,_long)> *)&local_f8);
  if (pcStack_e8 != (code *)0x0) {
    (*pcStack_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  TVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  ChannelNames_abi_cxx11_(&local_148,this,desc);
  local_d8.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  AVar21.memoryResource = pstd::pmr::new_delete_resource();
  channels_00.n =
       (long)local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  channels_00.ptr =
       local_148.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  Image(local_158,Float,(Point2i)TVar3,channels_00,&local_d8,AVar21);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  iVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  pcStack_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = operator_new(0x38);
  *(Image **)local_118._M_unused._0_8_ = this;
  *(ImageChannelDesc **)((long)local_118._M_unused._0_8_ + 8) = desc;
  *(int **)((long)local_118._M_unused._0_8_ + 0x10) = &local_15c;
  *(Image **)((long)local_118._M_unused._0_8_ + 0x18) = &local_c8;
  *(undefined4 **)((long)local_118._M_unused._0_8_ + 0x20) = &local_160;
  *(vector<float,_std::allocator<float>_> **)((long)local_118._M_unused._0_8_ + 0x28) = &local_130;
  *(Image **)((long)local_118._M_unused._0_8_ + 0x30) = local_158;
  pcStack_100 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:228:34)>
                ::_M_invoke;
  pcStack_108 = std::
                _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp:228:34)>
                ::_M_manager;
  ParallelFor(0,(long)iVar2,(function<void_(long,_long)> *)&local_118);
  if (pcStack_108 != (code *)0x0) {
    (*pcStack_108)(&local_118,&local_118,__destroy_functor);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_c8.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_c8.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            (&local_c8.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.channelNames);
  if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_158;
}

Assistant:

Image Image::GaussianFilter(const ImageChannelDesc &desc, int halfWidth,
                            Float sigma) const {
    // Compute filter weights
    std::vector<Float> wts(2 * halfWidth + 1, Float(0));
    for (int d = 0; d < 2 * halfWidth + 1; ++d)
        wts[d] = Gaussian(d - halfWidth, 0, sigma);

    // Normalize weights
    Float wtSum = std::accumulate(wts.begin(), wts.end(), Float(0));
    for (Float &w : wts)
        w /= wtSum;

    // Separable blur; first blur in x into blurx, selecting out the
    // desired channels along the way.
    Image blurx(PixelFormat::Float, resolution, ChannelNames(desc));
    int nc = desc.size();
    ParallelFor(0, resolution.y, [&](int64_t y0, int64_t y1) {
        for (int y = y0; y < y1; ++y) {
            for (int x = 0; x < resolution.x; ++x) {
                ImageChannelValues result(desc.size());
                for (int r = -halfWidth; r <= halfWidth; ++r) {
                    ImageChannelValues cv = GetChannels({x + r, y}, desc);
                    for (int c = 0; c < nc; ++c)
                        result[c] += wts[r + halfWidth] * cv[c];
                }
                blurx.SetChannels({x, y}, result);
            }
        }
    });

    // Now blur in y from blur x to the result; blurx has just the
    // channels we want already.
    Image blury(PixelFormat::Float, resolution, ChannelNames(desc));
    ParallelFor(0, resolution.y, [&](int64_t y0, int64_t y1) {
        for (int y = y0; y < y1; ++y) {
            for (int x = 0; x < resolution.x; ++x) {
                ImageChannelValues result(desc.size());
                for (int r = -halfWidth; r <= halfWidth; ++r) {
                    ImageChannelValues cv = blurx.GetChannels({x, y + r});
                    for (int c = 0; c < nc; ++c)
                        result[c] += wts[r + halfWidth] * cv[c];
                }
                blury.SetChannels({x, y}, result);
            }
        }
    });
    return blury;
}